

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O0

RPCHelpMan * deriveaddresses(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  string EXAMPLE_DESCRIPTOR;
  allocator<RPCResult> *in_stack_fffffffffffff208;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff220;
  RPCResults *in_stack_fffffffffffff230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff240;
  allocator<char> *in_stack_fffffffffffff248;
  iterator in_stack_fffffffffffff250;
  RPCArgOptions *in_stack_fffffffffffff258;
  string *in_stack_fffffffffffff260;
  undefined7 in_stack_fffffffffffff268;
  undefined1 in_stack_fffffffffffff26f;
  undefined4 in_stack_fffffffffffff270;
  Type in_stack_fffffffffffff274;
  string *in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff280;
  Type in_stack_fffffffffffff284;
  undefined4 in_stack_fffffffffffff288;
  Type in_stack_fffffffffffff28c;
  RPCResult *in_stack_fffffffffffff290;
  undefined1 *local_d08;
  undefined1 *local_cf0;
  RPCMethodImpl *local_cd8;
  undefined1 *local_cc0;
  RPCExamples *in_stack_fffffffffffff350;
  undefined1 *puVar2;
  RPCResults *in_stack_fffffffffffff358;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_af0 [36];
  undefined1 local_acc;
  undefined1 local_acb [3];
  pointer local_ac8;
  pointer pRStack_ac0;
  undefined8 local_ab8;
  allocator<char> local_aaa;
  allocator<char> local_aa9 [31];
  allocator<char> local_a8a;
  allocator<char> local_a89 [29];
  allocator<char> local_a6c;
  allocator<char> local_a6b;
  allocator<char> local_a6a [18];
  undefined8 local_a58;
  allocator<char> local_a42;
  allocator<char> local_a41 [30];
  allocator<char> local_a23;
  allocator<char> local_a22;
  allocator<char> local_a21 [32];
  allocator<char> local_a01;
  undefined4 local_a00;
  allocator<char> local_9fa;
  allocator<char> local_9f9;
  undefined4 local_9f8;
  allocator<char> local_9f1 [30];
  allocator<char> local_9d3;
  allocator<char> local_9d2;
  allocator<char> local_9d1 [417];
  RPCMethodImpl local_830 [4];
  RPCMethodImpl local_7a8 [2];
  undefined1 local_768 [136];
  undefined1 local_6e0 [160];
  undefined1 local_640 [136];
  undefined1 local_5b8 [96];
  undefined1 local_558 [272];
  undefined1 local_448 [40];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined1 local_320;
  undefined1 local_31f;
  undefined1 local_278 [528];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::~allocator(local_9d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_9f8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff218,(Optional *)in_stack_fffffffffffff210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_360 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff220);
  local_338 = 0;
  uStack_330 = 0;
  local_328 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff208);
  local_320 = 0;
  local_31f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                 in_stack_fffffffffffff278,in_stack_fffffffffffff274,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_a00 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff218,(Optional *)in_stack_fffffffffffff210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_448[0] = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff220);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff208);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                 in_stack_fffffffffffff278,in_stack_fffffffffffff274,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 in_stack_fffffffffffff260,in_stack_fffffffffffff258);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff208);
  __l._M_len = (size_type)in_stack_fffffffffffff258;
  __l._M_array = in_stack_fffffffffffff250;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff248,__l,
             (allocator_type *)in_stack_fffffffffffff240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_a6a[2] = (allocator<char>)0x0;
  local_a6a[3] = (allocator<char>)0x0;
  local_a6a[4] = (allocator<char>)0x0;
  local_a6a[5] = (allocator<char>)0x0;
  local_a6a[6] = (allocator<char>)0x0;
  local_a6a[7] = (allocator<char>)0x0;
  local_a6a[8] = (allocator<char>)0x0;
  local_a6a[9] = (allocator<char>)0x0;
  local_a6a[10] = (allocator<char>)0x0;
  local_a6a[0xb] = (allocator<char>)0x0;
  local_a6a[0xc] = (allocator<char>)0x0;
  local_a6a[0xd] = (allocator<char>)0x0;
  local_a6a[0xe] = (allocator<char>)0x0;
  local_a6a[0xf] = (allocator<char>)0x0;
  local_a6a[0x10] = (allocator<char>)0x0;
  local_a6a[0x11] = (allocator<char>)0x0;
  local_a58._0_1_ = '\0';
  local_a58._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff208);
  __l_00._M_len = (size_type)in_stack_fffffffffffff258;
  __l_00._M_array = (iterator)in_stack_fffffffffffff250;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff248,__l_00,
             (allocator_type *)in_stack_fffffffffffff240);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,
             (string *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
             in_stack_fffffffffffff284,in_stack_fffffffffffff278,
             (string *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_ac8 = (pointer)0x0;
  pRStack_ac0 = (pointer)0x0;
  local_ab8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  fun = local_830;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff208);
  __l_01._M_len = (size_type)in_stack_fffffffffffff258;
  __l_01._M_array = (iterator)in_stack_fffffffffffff250;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff248,__l_01,
             (allocator_type *)in_stack_fffffffffffff240);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  this_00 = (RPCHelpMan *)(local_acb + 1);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff208);
  __l_02._M_len = (size_type)in_stack_fffffffffffff258;
  __l_02._M_array = (iterator)in_stack_fffffffffffff250;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff248,__l_02,
             (allocator_type *)in_stack_fffffffffffff240);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,
             (string *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
             in_stack_fffffffffffff284,in_stack_fffffffffffff278,
             (string *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268));
  results._M_len = (size_type)in_stack_fffffffffffff258;
  results._M_array = (iterator)in_stack_fffffffffffff250;
  RPCResults::RPCResults(in_stack_fffffffffffff230,results);
  name = (string *)local_acb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::operator+(&in_stack_fffffffffffff258->skip_type_check,&in_stack_fffffffffffff250->m_names);
  std::operator+(in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218);
  HelpExampleCli(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  std::operator+((char *)in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  description = (string *)&local_acc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::operator+(&in_stack_fffffffffffff258->skip_type_check,&in_stack_fffffffffffff250->m_names);
  std::operator+(in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218);
  HelpExampleRpc(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  std::operator+(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff208,(string *)0x68866d);
  this = (RPCArg *)local_af0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<deriveaddresses()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,(vector<RPCArg,_std::allocator<RPCArg>_> *)this,
             in_stack_fffffffffffff358,in_stack_fffffffffffff350,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_acc);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_acb);
  RPCResults::~RPCResults((RPCResults *)this);
  puVar2 = local_558;
  puVar1 = local_448;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_cc0 = local_6e0;
  do {
    local_cc0 = local_cc0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_cc0 != local_768);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_cd8 = local_7a8;
  do {
    local_cd8 = (RPCMethodImpl *)&local_cd8[-5]._M_invoker;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_cd8 != local_830);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aaa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_aa9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a89);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a6c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a6b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a6a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_cf0 = local_5b8;
  do {
    local_cf0 = local_cf0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_cf0 != local_640);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a42);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a41);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a23);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a22);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a21);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d08 = local_68;
  do {
    local_d08 = local_d08 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d08 != local_278);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a01);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9f1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9d3);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9d2);
  std::__cxx11::string::~string(&this->m_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan deriveaddresses()
{
    const std::string EXAMPLE_DESCRIPTOR = "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu";

    return RPCHelpMan{"deriveaddresses",
        {"\nDerives one or more addresses corresponding to an output descriptor.\n"
         "Examples of output descriptors are:\n"
         "    pkh(<pubkey>)                                     P2PKH outputs for the given pubkey\n"
         "    wpkh(<pubkey>)                                    Native segwit P2PKH outputs for the given pubkey\n"
         "    sh(multi(<n>,<pubkey>,<pubkey>,...))              P2SH-multisig outputs for the given threshold and pubkeys\n"
         "    raw(<hex script>)                                 Outputs whose output script equals the specified hex-encoded bytes\n"
         "    tr(<pubkey>,multi_a(<n>,<pubkey>,<pubkey>,...))   P2TR-multisig outputs for the given threshold and pubkeys\n"
         "\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\n"
         "or more path elements separated by \"/\", where \"h\" represents a hardened child key.\n"
         "For more information on output descriptors, see the documentation in the doc/descriptors.md file.\n"},
        {
            {"descriptor", RPCArg::Type::STR, RPCArg::Optional::NO, "The descriptor."},
            {"range", RPCArg::Type::RANGE, RPCArg::Optional::OMITTED, "If a ranged descriptor is used, this specifies the end or the range (in [begin,end] notation) to derive."},
        },
        {
            RPCResult{"for single derivation descriptors",
                RPCResult::Type::ARR, "", "",
                {
                    {RPCResult::Type::STR, "address", "the derived addresses"},
                }
            },
            RPCResult{"for multipath descriptors",
                RPCResult::Type::ARR, "", "The derived addresses for each of the multipath expansions of the descriptor, in multipath specifier order",
                {
                    {
                        RPCResult::Type::ARR, "", "The derived addresses for a multipath descriptor expansion",
                        {
                            {RPCResult::Type::STR, "address", "the derived address"},
                        },
                    },
                },
            },
        },
        RPCExamples{
            "First three native segwit receive addresses\n" +
            HelpExampleCli("deriveaddresses", "\"" + EXAMPLE_DESCRIPTOR + "\" \"[0,2]\"") +
            HelpExampleRpc("deriveaddresses", "\"" + EXAMPLE_DESCRIPTOR + "\", \"[0,2]\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::string desc_str = request.params[0].get_str();

            int64_t range_begin = 0;
            int64_t range_end = 0;

            if (request.params.size() >= 2 && !request.params[1].isNull()) {
                std::tie(range_begin, range_end) = ParseDescriptorRange(request.params[1]);
            }

            FlatSigningProvider key_provider;
            std::string error;
            auto descs = Parse(desc_str, key_provider, error, /* require_checksum = */ true);
            if (descs.empty()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
            }
            auto& desc = descs.at(0);
            if (!desc->IsRange() && request.params.size() > 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should not be specified for an un-ranged descriptor");
            }

            if (desc->IsRange() && request.params.size() == 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Range must be specified for a ranged descriptor");
            }

            UniValue addresses = DeriveAddresses(desc.get(), range_begin, range_end, key_provider);

            if (descs.size() == 1) {
                return addresses;
            }

            UniValue ret(UniValue::VARR);
            ret.push_back(addresses);
            for (size_t i = 1; i < descs.size(); ++i) {
                ret.push_back(DeriveAddresses(descs.at(i).get(), range_begin, range_end, key_provider));
            }
            return ret;
        },
    };
}